

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O0

void pelelm_dcma(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
                Real param_7,int *param_8,int param_9)

{
  reference pvVar1;
  int in_EDX;
  long in_RSI;
  long in_R8;
  int n;
  GpuArray<double,_9U> fact_lcl;
  Real denom_inv;
  Real Zfu_lcl;
  Real Zox_lcl;
  Array4<double> hr;
  Array4<double> mixt_frac;
  Array4<double> rhoY_dot;
  Array4<double> Temp;
  Array4<const_double> rhoY;
  Array4<const_double> density;
  size_type in_stack_fffffffffffff408;
  array<double,_9UL> *in_stack_fffffffffffff410;
  Array4<const_double> *rhs;
  undefined1 auStack_bb0 [8];
  anon_class_472_9_608565ce *in_stack_fffffffffffff458;
  Box *in_stack_fffffffffffff460;
  undefined1 auStack_b68 [64];
  undefined1 auStack_b28 [64];
  undefined1 auStack_ae8 [64];
  undefined1 auStack_aa8 [64];
  undefined1 auStack_a68 [64];
  undefined1 auStack_a28 [68];
  int local_9e4;
  value_type_conflict1 local_9e0 [9];
  double local_998;
  Real local_990;
  Real local_988;
  Array4<double> local_980;
  Array4<double> local_940;
  Array4<double> local_900;
  Array4<double> local_8c0;
  Array4<const_double> local_880;
  Array4<const_double> local_840;
  long local_7f0;
  int local_7e4;
  long local_7e0;
  Array4<double> local_7d0;
  int local_78c;
  long local_788;
  Array4<double> local_780;
  int local_73c;
  long local_738;
  Array4<double> local_730;
  int local_6ec;
  long local_6e8;
  Array4<double> local_6e0;
  int local_69c;
  long local_698;
  Array4<const_double> local_690;
  int local_64c;
  long local_648;
  Array4<const_double> local_640;
  int local_5fc;
  char *local_5f0;
  int local_5e4;
  value_type_conflict1 *local_5e0;
  Dim3 local_5d8;
  Dim3 local_5c8;
  Dim3 local_5b8;
  Dim3 local_5a8;
  int local_59c;
  undefined8 *local_598;
  double *local_590;
  Dim3 local_588;
  Dim3 local_578;
  Dim3 local_568;
  Dim3 local_558;
  int local_54c;
  undefined8 *local_548;
  double *local_540;
  Dim3 local_538;
  undefined8 *local_528;
  undefined4 local_51c;
  undefined4 uStack_518;
  int local_514;
  Dim3 local_510;
  undefined8 *local_500;
  undefined4 local_4f4;
  undefined4 uStack_4f0;
  int local_4ec;
  Dim3 local_4e8;
  undefined8 *local_4d8;
  int local_4cc;
  int iStack_4c8;
  int local_4c4;
  Dim3 local_4c0;
  undefined8 *local_4b0;
  int local_4a8;
  int iStack_4a4;
  int local_4a0;
  undefined4 local_49c;
  long local_498;
  undefined4 local_48c;
  long local_488;
  undefined4 local_47c;
  int *local_478;
  undefined4 local_46c;
  long local_468;
  undefined4 local_45c;
  long local_458;
  undefined4 local_44c;
  int *local_448;
  undefined4 local_43c;
  undefined8 *local_438;
  undefined4 local_42c;
  undefined8 *local_428;
  undefined4 local_41c;
  undefined8 *local_418;
  undefined4 local_40c;
  undefined8 *local_408;
  undefined4 local_3fc;
  undefined8 *local_3f8;
  undefined4 local_3ec;
  undefined8 *local_3e8;
  Dim3 local_3e0;
  Dim3 local_3d0;
  Dim3 local_3c0;
  Dim3 local_3b0;
  int local_3a4;
  undefined8 *local_3a0;
  double *local_398;
  Dim3 local_390;
  undefined8 *local_380;
  undefined4 local_374;
  undefined4 uStack_370;
  int local_36c;
  Dim3 local_368;
  undefined8 *local_358;
  int local_350;
  int iStack_34c;
  int local_348;
  undefined4 local_344;
  long local_340;
  undefined4 local_334;
  long local_330;
  undefined4 local_324;
  int *local_320;
  undefined4 local_314;
  undefined8 *local_310;
  undefined4 local_304;
  undefined8 *local_300;
  undefined4 local_2f4;
  undefined8 *local_2f0;
  Dim3 local_2e8;
  Dim3 local_2d8;
  Dim3 local_2c8;
  Dim3 local_2b8;
  int local_2ac;
  undefined8 *local_2a8;
  double *local_2a0;
  Dim3 local_298;
  undefined8 *local_288;
  undefined4 local_27c;
  undefined4 uStack_278;
  int local_274;
  Dim3 local_270;
  undefined8 *local_260;
  int local_258;
  int iStack_254;
  int local_250;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  undefined8 *local_218;
  undefined4 local_20c;
  undefined8 *local_208;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  Dim3 local_1f0;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  int local_1b4;
  undefined8 *local_1b0;
  double *local_1a8;
  Dim3 local_1a0;
  undefined8 *local_190;
  undefined4 local_184;
  undefined4 uStack_180;
  int local_17c;
  Dim3 local_178;
  undefined8 *local_168;
  int local_160;
  int iStack_15c;
  int local_158;
  undefined4 local_154;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  Dim3 local_f8;
  Dim3 local_e4;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  undefined8 *local_b8;
  double *local_b0;
  Dim3 local_a8;
  undefined8 *local_98;
  undefined4 local_8c;
  undefined4 uStack_88;
  int local_84;
  Dim3 local_80;
  undefined8 *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_5fc = 0;
  local_590 = *(double **)(in_R8 + 0x10);
  local_598 = (undefined8 *)(in_R8 + 0x18);
  local_59c = *(int *)(in_R8 + 0x34);
  local_41c = 0;
  local_4f4 = *(undefined4 *)local_598;
  local_42c = 1;
  uStack_4f0 = *(undefined4 *)(in_R8 + 0x1c);
  local_5b8._0_8_ = *local_598;
  local_43c = 2;
  local_5b8.z = *(int *)(in_R8 + 0x20);
  local_478 = (int *)(in_R8 + 0x24);
  local_47c = 0;
  local_4a8 = *local_478 + 1;
  local_488 = in_R8 + 0x24;
  local_48c = 1;
  iStack_4a4 = *(int *)(in_R8 + 0x28) + 1;
  local_498 = in_R8 + 0x24;
  local_49c = 2;
  local_5d8.z = *(int *)(in_R8 + 0x2c) + 1;
  local_5d8.y = iStack_4a4;
  local_5d8.x = local_4a8;
  local_7f0 = in_R8;
  local_7e4 = in_EDX;
  local_7e0 = in_RSI;
  local_5c8._0_8_ = local_5d8._0_8_;
  local_5c8.z = local_5d8.z;
  local_5a8._0_8_ = local_5b8._0_8_;
  local_5a8.z = local_5b8.z;
  local_510._0_8_ = local_5b8._0_8_;
  local_510.z = local_5b8.z;
  local_500 = local_598;
  local_4ec = local_5b8.z;
  local_4c0._0_8_ = local_5d8._0_8_;
  local_4c0.z = local_5d8.z;
  local_4b0 = local_598;
  local_4a0 = local_5d8.z;
  local_438 = local_598;
  local_428 = local_598;
  local_418 = local_598;
  amrex::Array4<const_double>::Array4(&local_640,local_590,&local_5a8,&local_5c8,local_59c);
  amrex::Array4<const_double>::Array4<const_double,_0>(&local_840,&local_640,local_5fc);
  local_648 = local_7f0;
  local_64c = 1;
  local_540 = *(double **)(local_7f0 + 0x10);
  local_548 = (undefined8 *)(local_7f0 + 0x18);
  local_54c = *(int *)(local_7f0 + 0x34);
  local_3ec = 0;
  local_51c = *(undefined4 *)local_548;
  local_3fc = 1;
  uStack_518 = *(undefined4 *)(local_7f0 + 0x1c);
  local_568._0_8_ = *local_548;
  local_40c = 2;
  local_568.z = *(int *)(local_7f0 + 0x20);
  local_448 = (int *)(local_7f0 + 0x24);
  local_44c = 0;
  local_4cc = *local_448 + 1;
  local_458 = local_7f0 + 0x24;
  local_45c = 1;
  iStack_4c8 = *(int *)(local_7f0 + 0x28) + 1;
  local_468 = local_7f0 + 0x24;
  local_46c = 2;
  local_588.z = *(int *)(local_7f0 + 0x2c) + 1;
  local_588.y = iStack_4c8;
  local_588.x = local_4cc;
  rhs = &local_690;
  local_578._0_8_ = local_588._0_8_;
  local_578.z = local_588.z;
  local_558._0_8_ = local_568._0_8_;
  local_558.z = local_568.z;
  local_538._0_8_ = local_568._0_8_;
  local_538.z = local_568.z;
  local_528 = local_548;
  local_514 = local_568.z;
  local_4e8._0_8_ = local_588._0_8_;
  local_4e8.z = local_588.z;
  local_4d8 = local_548;
  local_4c4 = local_588.z;
  local_408 = local_548;
  local_3f8 = local_548;
  local_3e8 = local_548;
  amrex::Array4<const_double>::Array4(rhs,local_540,&local_558,&local_578,local_54c);
  amrex::Array4<const_double>::Array4<const_double,_0>(&local_880,rhs,local_64c);
  local_698 = local_7e0;
  local_69c = 10;
  local_398 = *(double **)(local_7e0 + 0x10);
  local_3a0 = (undefined8 *)(local_7e0 + 0x18);
  local_3a4 = *(int *)(local_7e0 + 0x34);
  local_2f4 = 0;
  local_374 = *(undefined4 *)local_3a0;
  local_304 = 1;
  uStack_370 = *(undefined4 *)(local_7e0 + 0x1c);
  local_3c0._0_8_ = *local_3a0;
  local_314 = 2;
  local_3c0.z = *(int *)(local_7e0 + 0x20);
  local_320 = (int *)(local_7e0 + 0x24);
  local_324 = 0;
  local_350 = *local_320 + 1;
  local_330 = local_7e0 + 0x24;
  local_334 = 1;
  iStack_34c = *(int *)(local_7e0 + 0x28) + 1;
  local_340 = local_7e0 + 0x24;
  local_344 = 2;
  local_3e0.z = *(int *)(local_7e0 + 0x2c) + 1;
  local_3e0.y = iStack_34c;
  local_3e0.x = local_350;
  local_3d0._0_8_ = local_3e0._0_8_;
  local_3d0.z = local_3e0.z;
  local_3b0._0_8_ = local_3c0._0_8_;
  local_3b0.z = local_3c0.z;
  local_390._0_8_ = local_3c0._0_8_;
  local_390.z = local_3c0.z;
  local_380 = local_3a0;
  local_36c = local_3c0.z;
  local_368._0_8_ = local_3e0._0_8_;
  local_368.z = local_3e0.z;
  local_358 = local_3a0;
  local_348 = local_3e0.z;
  local_310 = local_3a0;
  local_300 = local_3a0;
  local_2f0 = local_3a0;
  amrex::Array4<double>::Array4(&local_6e0,local_398,&local_3b0,&local_3d0,local_3a4);
  amrex::Array4<double>::Array4<double,_0>(&local_8c0,&local_6e0,local_69c);
  local_6e8 = local_7e0;
  local_6ec = 0xb;
  local_2a0 = *(double **)(local_7e0 + 0x10);
  local_2a8 = (undefined8 *)(local_7e0 + 0x18);
  local_2ac = *(int *)(local_7e0 + 0x34);
  local_1fc = 0;
  local_27c = *(undefined4 *)local_2a8;
  local_20c = 1;
  uStack_278 = *(undefined4 *)(local_7e0 + 0x1c);
  local_2c8._0_8_ = *local_2a8;
  local_21c = 2;
  local_2c8.z = *(int *)(local_7e0 + 0x20);
  local_228 = (int *)(local_7e0 + 0x24);
  local_22c = 0;
  local_258 = *local_228 + 1;
  local_238 = local_7e0 + 0x24;
  local_23c = 1;
  iStack_254 = *(int *)(local_7e0 + 0x28) + 1;
  local_248 = local_7e0 + 0x24;
  local_24c = 2;
  local_2e8.z = *(int *)(local_7e0 + 0x2c) + 1;
  local_2e8.y = iStack_254;
  local_2e8.x = local_258;
  local_2d8._0_8_ = local_2e8._0_8_;
  local_2d8.z = local_2e8.z;
  local_2b8._0_8_ = local_2c8._0_8_;
  local_2b8.z = local_2c8.z;
  local_298._0_8_ = local_2c8._0_8_;
  local_298.z = local_2c8.z;
  local_288 = local_2a8;
  local_274 = local_2c8.z;
  local_270._0_8_ = local_2e8._0_8_;
  local_270.z = local_2e8.z;
  local_260 = local_2a8;
  local_250 = local_2e8.z;
  local_218 = local_2a8;
  local_208 = local_2a8;
  local_1f8 = local_2a8;
  amrex::Array4<double>::Array4(&local_730,local_2a0,&local_2b8,&local_2d8,local_2ac);
  amrex::Array4<double>::Array4<double,_0>(&local_900,&local_730,local_6ec);
  local_738 = local_7e0;
  local_73c = local_7e4;
  local_1a8 = *(double **)(local_7e0 + 0x10);
  local_1b0 = (undefined8 *)(local_7e0 + 0x18);
  local_1b4 = *(int *)(local_7e0 + 0x34);
  local_104 = 0;
  local_184 = *(undefined4 *)local_1b0;
  local_114 = 1;
  uStack_180 = *(undefined4 *)(local_7e0 + 0x1c);
  local_1d0._0_8_ = *local_1b0;
  local_124 = 2;
  local_1d0.z = *(int *)(local_7e0 + 0x20);
  local_130 = (int *)(local_7e0 + 0x24);
  local_134 = 0;
  local_160 = *local_130 + 1;
  local_140 = local_7e0 + 0x24;
  local_144 = 1;
  iStack_15c = *(int *)(local_7e0 + 0x28) + 1;
  local_150 = local_7e0 + 0x24;
  local_154 = 2;
  local_1f0.z = *(int *)(local_7e0 + 0x2c) + 1;
  local_1f0.y = iStack_15c;
  local_1f0.x = local_160;
  local_1e0._0_8_ = local_1f0._0_8_;
  local_1e0.z = local_1f0.z;
  local_1c0._0_8_ = local_1d0._0_8_;
  local_1c0.z = local_1d0.z;
  local_1a0._0_8_ = local_1d0._0_8_;
  local_1a0.z = local_1d0.z;
  local_190 = local_1b0;
  local_17c = local_1d0.z;
  local_178._0_8_ = local_1f0._0_8_;
  local_178.z = local_1f0.z;
  local_168 = local_1b0;
  local_158 = local_1f0.z;
  local_120 = local_1b0;
  local_110 = local_1b0;
  local_100 = local_1b0;
  amrex::Array4<double>::Array4(&local_780,local_1a8,&local_1c0,&local_1e0,local_1b4);
  amrex::Array4<double>::Array4<double,_0>(&local_940,&local_780,local_73c);
  local_78c = local_7e4 + 1;
  local_788 = local_7e0;
  local_b0 = *(double **)(local_7e0 + 0x10);
  local_b8 = (undefined8 *)(local_7e0 + 0x18);
  local_bc = *(int *)(local_7e0 + 0x34);
  local_c = 0;
  local_8c = *(undefined4 *)local_b8;
  local_1c = 1;
  uStack_88 = *(undefined4 *)(local_7e0 + 0x1c);
  local_d8._0_8_ = *local_b8;
  local_2c = 2;
  local_d8.z = *(int *)(local_7e0 + 0x20);
  local_38 = (int *)(local_7e0 + 0x24);
  local_3c = 0;
  local_68 = *local_38 + 1;
  local_48 = local_7e0 + 0x24;
  local_4c = 1;
  iStack_64 = *(int *)(local_7e0 + 0x28) + 1;
  local_58 = local_7e0 + 0x24;
  local_5c = 2;
  local_f8.z = *(int *)(local_7e0 + 0x2c) + 1;
  local_f8.y = iStack_64;
  local_f8.x = local_68;
  local_e4._0_8_ = local_f8._0_8_;
  local_e4.z = local_f8.z;
  local_c8._0_8_ = local_d8._0_8_;
  local_c8.z = local_d8.z;
  local_a8._0_8_ = local_d8._0_8_;
  local_a8.z = local_d8.z;
  local_98 = local_b8;
  local_84 = local_d8.z;
  local_80._0_8_ = local_f8._0_8_;
  local_80.z = local_f8.z;
  local_70 = local_b8;
  local_60 = local_f8.z;
  local_28 = local_b8;
  local_18 = local_b8;
  local_8 = local_b8;
  amrex::Array4<double>::Array4(&local_7d0,local_b0,&local_c8,&local_e4,local_bc);
  amrex::Array4<double>::Array4<double,_0>(&local_980,&local_7d0,local_78c);
  local_5f0 = "C12H25O2 is not present in your chemistry: do not use dcma.";
  amrex::Abort_host((char *)rhs);
  local_988 = PeleLM::Zox;
  local_990 = PeleLM::Zfu;
  local_998 = 1.0 / (PeleLM::Zfu - PeleLM::Zox);
  for (local_9e4 = 0; local_9e4 < 9; local_9e4 = local_9e4 + 1) {
    pvVar1 = std::array<double,_9UL>::operator[]
                       (in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    local_5e4 = local_9e4;
    local_5e0 = local_9e0;
    local_5e0[local_9e4] = *pvVar1;
  }
  memcpy(auStack_bb0,local_9e0,0x48);
  memcpy(auStack_b68,&local_840,0x3c);
  memcpy(auStack_b28,&local_880,0x3c);
  memcpy(auStack_ae8,&local_940,0x3c);
  memcpy(auStack_aa8,&local_8c0,0x3c);
  memcpy(auStack_a68,&local_980,0x3c);
  memcpy(auStack_a28,&local_900,0x3c);
  amrex::
  ParallelFor<pelelm_dcma(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__0>
            (in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  return;
}

Assistant:

void pelelm_dcma (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                              const FArrayBox& datfab, const Geometry& /*geomdata*/,
                              Real /*time*/, const int* /*bcrec*/, int /*level*/)

{   
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).enclosedCells().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 2*NUM_SPECIES+2);
    AMREX_ASSERT(ncomp == 4);
    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto const Temp      = derfab.array(NUM_SPECIES+1);
    auto const rhoY_dot  = derfab.array(NUM_SPECIES+2);
    auto       mixt_frac = derfab.array(dcomp);
    auto       hr        = derfab.array(dcomp+1);

#ifdef C12H25O2_ID
    auto       Y1        = derfab.array(dcomp+2);
    auto       Y2        = derfab.array(dcomp+3);
    int        OH        = OH_ID;
    int        RO2       = C12H25O2_ID;
#else
    amrex::Abort("C12H25O2 is not present in your chemistry: do not use dcma.");
#endif

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx, 
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {   
        // Z
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
        auto eos = pele::physics::PhysicsType::eos();
        // HR
        amrex::Real hi_spec[NUM_SPECIES] = {0.0};
        eos.T2Hi(Temp(i,j,k),hi_spec);
        hr(i,j,k) = 0.0;
        for (int n = 0; n < NUM_SPECIES; n++) {
            hi_spec[n] *= 0.0001;   // erg/g -> J/kg
            hr(i,j,k) -= rhoY_dot(i,j,k,n)*hi_spec[n];
        }

        // Y
#ifdef C12H25O2_ID
        amrex::Real rho_inv = 1.0 / density(i,j,k);
        Y1(i,j,k) = rhoY(i,j,k,OH)  * rho_inv; 
        Y2(i,j,k) = rhoY(i,j,k,RO2) * rho_inv; 
#endif
    });
}